

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwGetMonitorContentScale(GLFWmonitor *handle,float *xscale,float *yscale)

{
  _GLFWmonitor *monitor;
  float *yscale_local;
  float *xscale_local;
  GLFWmonitor *handle_local;
  
  if (handle != (GLFWmonitor *)0x0) {
    if (xscale != (float *)0x0) {
      *xscale = 0.0;
    }
    if (yscale != (float *)0x0) {
      *yscale = 0.0;
    }
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      (*_glfw.platform.getMonitorContentScale)((_GLFWmonitor *)handle,xscale,yscale);
    }
    return;
  }
  __assert_fail("monitor != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/cal-cs184[P]hw0-intro/CGL/deps/glfw/src/monitor.c"
                ,0x182,"void glfwGetMonitorContentScale(GLFWmonitor *, float *, float *)");
}

Assistant:

GLFWAPI void glfwGetMonitorContentScale(GLFWmonitor* handle,
                                        float* xscale, float* yscale)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xscale)
        *xscale = 0.f;
    if (yscale)
        *yscale = 0.f;

    _GLFW_REQUIRE_INIT();
    _glfw.platform.getMonitorContentScale(monitor, xscale, yscale);
}